

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivCountOne(Gia_Man_t *p,int i)

{
  uint uVar1;
  int iVar2;
  
  if (((~(uint)p->pReprs[i] & 0xfffffff) == 0) && (0 < p->pNexts[i])) {
    uVar1 = p->pNexts[i];
    iVar2 = 1;
    while( true ) {
      if ((int)uVar1 < 1) {
        return iVar2;
      }
      if (((uint)p->pReprs[uVar1] & 0xfffffff) != i) break;
      iVar2 = iVar2 + 1;
      uVar1 = p->pNexts[uVar1];
    }
    __assert_fail("Gia_ObjRepr(p, Ent) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x1c2,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
  }
  __assert_fail("Gia_ObjIsHead(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x1c0,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEquivCountOne( Gia_Man_t * p, int i )
{
    int Ent, nLits = 1;
    Gia_ClassForEachObj1( p, i, Ent )
    {
        assert( Gia_ObjRepr(p, Ent) == i );
        nLits++;
    }
    return nLits;
}